

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

void apx_server_start(apx_server_t *self)

{
  undefined8 *puVar1;
  int iVar2;
  adt_list_elem_t *pElem;
  
  if (self != (apx_server_t *)0x0) {
    for (pElem = adt_list_iter_first(&self->extension_manager); pElem != (adt_list_elem_t *)0x0;
        pElem = adt_list_iter_next(pElem)) {
      puVar1 = (undefined8 *)pElem->pItem;
      if ((code *)*puVar1 != (code *)0x0) {
        (*(code *)*puVar1)(self);
        if ((dtl_dv_t *)puVar1[2] != (dtl_dv_t *)0x0) {
          dtl_dv_dec_ref((dtl_dv_t *)puVar1[2]);
          puVar1[2] = 0;
        }
      }
    }
    apx_connectionManager_start(&self->connection_manager);
    if (self->is_event_thread_valid == false) {
      self->is_event_thread_valid = true;
      iVar2 = pthread_create(&self->event_thread,(pthread_attr_t *)0x0,thread_task,self);
      if (iVar2 != 0) {
        self->is_event_thread_valid = false;
      }
    }
  }
  return;
}

Assistant:

void apx_server_start(apx_server_t *self)
{

   if( self != 0 )
   {
      apx_server_init_extensions(self);
#ifndef UNIT_TEST
      apx_connectionManager_start(&self->connection_manager);
      if (self->is_event_thread_valid == false)
      {
         apx_server_start_thread(self);
      }
#endif
   }
}